

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O2

void __thiscall
CompletionProvider::registerCapabilities(CompletionProvider *this,ServerCapabilities *capabilities)

{
  long lVar1;
  allocator<char> local_10d;
  allocator<char> local_10c;
  allocator<char> local_10b;
  allocator<char> local_10a;
  allocator<char> local_109;
  undefined1 local_108 [64];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  CompletionOptions local_48;
  
  if ((capabilities->completionProvider).is_some == false) {
    local_48.resolveProvider = false;
    local_48._9_7_ = 0;
    local_48.super_Reflectable._vptr_Reflectable = (_func_int **)&PTR_reflect_00203620;
    local_48.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.triggerCharacters.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    optional<Init::CompletionOptions>::optional
              ((optional<Init::CompletionOptions> *)local_108,&local_48);
    optional<Init::CompletionOptions>::operator=
              (&capabilities->completionProvider,(optional<Init::CompletionOptions> *)local_108);
    Init::CompletionOptions::~CompletionOptions((CompletionOptions *)local_108);
    Init::CompletionOptions::~CompletionOptions(&local_48);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"\\",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_108 + 0x20),"@",&local_109);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"!",&local_10a);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"$",&local_10b);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"#",&local_10c);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"&",&local_10d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(capabilities->completionProvider).value.triggerCharacters,local_108,&local_48);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)(local_108 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void CompletionProvider::registerCapabilities (Init::ServerCapabilities &capabilities) {
    if (!capabilities.completionProvider) capabilities.completionProvider = Init::CompletionOptions {};

    /*
     * \ - command
     * @ - citation
     * ! - magic comment
     * $ - math shift
     * # - reference (planned)
     * & - environment (planned)
     */
    capabilities.completionProvider->triggerCharacters = { "\\", "@", "!", "$", "#", "&" };
}